

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MatrixUtils.cpp
# Opt level: O2

set<RationalNum,_std::less<RationalNum>,_std::allocator<RationalNum>_> *
findRationalSolutions
          (set<RationalNum,_std::less<RationalNum>,_std::allocator<RationalNum>_>
           *__return_storage_ptr__,Polynomial *polynomial)

{
  _Rb_tree_header *p_Var1;
  RationalNum *pRVar2;
  longlong numerator_;
  bool bVar3;
  int iVar4;
  int iVar5;
  _Base_ptr p_Var6;
  _Base_ptr p_Var7;
  long lVar8;
  long lVar9;
  ulong uVar10;
  int i;
  ulong uVar11;
  long lVar12;
  RationalNum x_00;
  RationalNum local_d8;
  RationalNum x;
  RationalNum local_b0;
  set<long_long,_std::less<long_long>,_std::allocator<long_long>_> qValues;
  set<long_long,_std::less<long_long>,_std::allocator<long_long>_> pValues;
  RationalNum local_40;
  
  lVar12 = 1;
  lVar8 = 0;
  for (uVar11 = 0; uVar11 <= polynomial->degree; uVar11 = uVar11 + 1) {
    iVar4 = RationalNum::getDenominator
                      ((RationalNum *)((long)&polynomial->coefficients->numerator + lVar8));
    lVar12 = lVar12 * iVar4;
    lVar8 = lVar8 + 0x10;
  }
  pValues._M_t._M_impl.super__Rb_tree_header._M_header._M_left =
       &pValues._M_t._M_impl.super__Rb_tree_header._M_header;
  pValues._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  pValues._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  pValues._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
  uVar11 = 0xffffffffffffffff;
  lVar8 = -0x10;
  pValues._M_t._M_impl.super__Rb_tree_header._M_header._M_right =
       pValues._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
  do {
    lVar9 = lVar8;
    uVar10 = (ulong)polynomial->degree;
    uVar11 = uVar11 + 1;
    if (uVar10 < uVar11) goto LAB_001127c8;
    pRVar2 = polynomial->coefficients;
    RationalNum::RationalNum((RationalNum *)&qValues,0,1);
    bVar3 = operator!=((RationalNum *)((long)&pRVar2[1].numerator + lVar9),(RationalNum *)&qValues);
    lVar8 = lVar9 + 0x10;
  } while (!bVar3);
  iVar4 = RationalNum::getNumerator
                    ((RationalNum *)((long)&polynomial->coefficients[1].numerator + lVar9));
  iVar5 = RationalNum::getDenominator(polynomial->coefficients);
  getDivisors(&qValues,(long)iVar4 * (lVar12 / (long)iVar5));
  std::
  _Rb_tree<long_long,_long_long,_std::_Identity<long_long>,_std::less<long_long>,_std::allocator<long_long>_>
  ::operator=(&pValues._M_t,&qValues._M_t);
  std::
  _Rb_tree<long_long,_long_long,_std::_Identity<long_long>,_std::less<long_long>,_std::allocator<long_long>_>
  ::~_Rb_tree(&qValues._M_t);
  uVar10 = (ulong)polynomial->degree;
LAB_001127c8:
  iVar4 = RationalNum::getNumerator(polynomial->coefficients + uVar10);
  iVar5 = RationalNum::getDenominator(polynomial->coefficients + polynomial->degree);
  getDivisors(&qValues,(long)iVar4 * (lVar12 / (long)iVar5));
  p_Var1 = &(__return_storage_ptr__->_M_t)._M_impl.super__Rb_tree_header;
  (__return_storage_ptr__->_M_t)._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  (__return_storage_ptr__->_M_t)._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  (__return_storage_ptr__->_M_t)._M_impl.super__Rb_tree_header._M_header._M_left =
       &p_Var1->_M_header;
  (__return_storage_ptr__->_M_t)._M_impl.super__Rb_tree_header._M_header._M_right =
       &p_Var1->_M_header;
  (__return_storage_ptr__->_M_t)._M_impl.super__Rb_tree_header._M_node_count = 0;
  for (p_Var7 = pValues._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
      (_Rb_tree_header *)p_Var7 != &pValues._M_t._M_impl.super__Rb_tree_header;
      p_Var7 = (_Base_ptr)std::_Rb_tree_increment(p_Var7)) {
    numerator_ = *(longlong *)(p_Var7 + 1);
    for (p_Var6 = qValues._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
        (_Rb_tree_header *)p_Var6 != &qValues._M_t._M_impl.super__Rb_tree_header;
        p_Var6 = (_Base_ptr)std::_Rb_tree_increment(p_Var6)) {
      RationalNum::RationalNum(&x,numerator_,*(longlong *)(p_Var6 + 1));
      local_d8 = getPolynomialValue(polynomial,x);
      RationalNum::RationalNum(&local_40,0,1);
      bVar3 = operator==(&local_d8,&local_40);
      if (bVar3) {
        std::
        _Rb_tree<RationalNum,RationalNum,std::_Identity<RationalNum>,std::less<RationalNum>,std::allocator<RationalNum>>
        ::_M_insert_unique<RationalNum_const&>
                  ((_Rb_tree<RationalNum,RationalNum,std::_Identity<RationalNum>,std::less<RationalNum>,std::allocator<RationalNum>>
                    *)__return_storage_ptr__,&x);
      }
      x_00 = RationalNum::operator-(&x);
      local_d8 = getPolynomialValue(polynomial,x_00);
      RationalNum::RationalNum(&local_40,0,1);
      bVar3 = operator==(&local_d8,&local_40);
      if (bVar3) {
        local_d8 = RationalNum::operator-(&x);
        std::
        _Rb_tree<RationalNum,_RationalNum,_std::_Identity<RationalNum>,_std::less<RationalNum>,_std::allocator<RationalNum>_>
        ::_M_insert_unique<RationalNum>(&__return_storage_ptr__->_M_t,&local_d8);
      }
    }
  }
  RationalNum::RationalNum(&local_b0,0,1);
  x = getPolynomialValue(polynomial,local_b0);
  RationalNum::RationalNum(&local_d8,0,1);
  bVar3 = operator==(&x,&local_d8);
  if (bVar3) {
    RationalNum::RationalNum(&x,0,1);
    std::
    _Rb_tree<RationalNum,_RationalNum,_std::_Identity<RationalNum>,_std::less<RationalNum>,_std::allocator<RationalNum>_>
    ::_M_insert_unique<RationalNum>(&__return_storage_ptr__->_M_t,&x);
  }
  std::
  _Rb_tree<long_long,_long_long,_std::_Identity<long_long>,_std::less<long_long>,_std::allocator<long_long>_>
  ::~_Rb_tree(&qValues._M_t);
  std::
  _Rb_tree<long_long,_long_long,_std::_Identity<long_long>,_std::less<long_long>,_std::allocator<long_long>_>
  ::~_Rb_tree(&pValues._M_t);
  return __return_storage_ptr__;
}

Assistant:

set<RationalNum> findRationalSolutions(Polynomial* polynomial) {
    long long int commonDenominator = 1;
    for(int i = 0; i <= polynomial->degree; i++) commonDenominator *= polynomial->coefficients[i].getDenominator();

    set<long long int> pValues;
    for(int i = 0; i <= polynomial->degree; i++) {
        if(polynomial->coefficients[i] != 0ll) {
            pValues = getDivisors(polynomial->coefficients[i].getNumerator() * (commonDenominator / polynomial->coefficients[0].getDenominator()));
            break;
        }
    }
    set<long long int> qValues = getDivisors(polynomial->coefficients[polynomial->degree].getNumerator() * (commonDenominator / polynomial->coefficients[polynomial->degree].getDenominator()));

    set<RationalNum> rationalSolutions;
    for(auto p : pValues) {
        for(auto q : qValues) {
            RationalNum x(p, q);
            if(getPolynomialValue(polynomial, x) == 0ll) rationalSolutions.insert(x);
            if(getPolynomialValue(polynomial, -x) == 0ll) rationalSolutions.insert(-x);
        }
    }
    if(getPolynomialValue(polynomial, 0ll) == 0ll) rationalSolutions.insert(0ll);

    return rationalSolutions;
}